

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

void ZSTD_window_enforceMaxDist
               (ZSTD_window_t *window,void *srcEnd,U32 maxDist,U32 *loadedDictEndPtr,
               ZSTD_matchState_t **dictMatchStatePtr)

{
  uint uVar1;
  U32 local_40;
  U32 newLowLimit;
  U32 loadedDictEnd;
  U32 blockEndIdx;
  ZSTD_matchState_t **dictMatchStatePtr_local;
  U32 *loadedDictEndPtr_local;
  U32 maxDist_local;
  void *srcEnd_local;
  ZSTD_window_t *window_local;
  
  uVar1 = (int)srcEnd - (int)window->base;
  if (loadedDictEndPtr == (U32 *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = *loadedDictEndPtr;
  }
  if (maxDist + local_40 < uVar1) {
    uVar1 = uVar1 - maxDist;
    if (window->lowLimit < uVar1) {
      window->lowLimit = uVar1;
    }
    if (window->dictLimit < window->lowLimit) {
      window->dictLimit = window->lowLimit;
    }
    if (loadedDictEndPtr != (U32 *)0x0) {
      *loadedDictEndPtr = 0;
    }
    if (dictMatchStatePtr != (ZSTD_matchState_t **)0x0) {
      *dictMatchStatePtr = (ZSTD_matchState_t *)0x0;
    }
  }
  return;
}

Assistant:

MEM_STATIC void
ZSTD_window_enforceMaxDist(ZSTD_window_t* window,
                           void const* srcEnd,
                           U32 maxDist,
                           U32* loadedDictEndPtr,
                     const ZSTD_matchState_t** dictMatchStatePtr)
{
    U32 const blockEndIdx = (U32)((BYTE const*)srcEnd - window->base);
    U32 loadedDictEnd = (loadedDictEndPtr != NULL) ? *loadedDictEndPtr : 0;
    DEBUGLOG(5, "ZSTD_window_enforceMaxDist: blockEndIdx=%u, maxDist=%u",
                (unsigned)blockEndIdx, (unsigned)maxDist);
    if (blockEndIdx > maxDist + loadedDictEnd) {
        U32 const newLowLimit = blockEndIdx - maxDist;
        if (window->lowLimit < newLowLimit) window->lowLimit = newLowLimit;
        if (window->dictLimit < window->lowLimit) {
            DEBUGLOG(5, "Update dictLimit to match lowLimit, from %u to %u",
                        (unsigned)window->dictLimit, (unsigned)window->lowLimit);
            window->dictLimit = window->lowLimit;
        }
        if (loadedDictEndPtr)
            *loadedDictEndPtr = 0;
        if (dictMatchStatePtr)
            *dictMatchStatePtr = NULL;
    }
}